

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

pair<int,_int> __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
find_insert_position
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int *key)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined8 in_XMM0_Qa;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  iVar4 = *key;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (this->super_AlexNode<int,_int>).model_.a_;
  iVar2 = this->data_capacity_;
  auVar13._0_8_ = (double)iVar4;
  auVar13._8_8_ = in_XMM0_Qa;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->super_AlexNode<int,_int>).model_.b_;
  auVar1 = vfmadd213sd_fma(auVar13,auVar14,auVar1);
  uVar5 = (int)auVar1._0_8_;
  if ((int)(iVar2 - 1U) < (int)auVar1._0_8_) {
    uVar5 = iVar2 - 1U;
  }
  uVar12 = ~((int)uVar5 >> 0x1f) & uVar5;
  piVar3 = this->key_slots_;
  if (iVar4 < piVar3[uVar12]) {
    uVar8 = 1;
    if (1 < (int)uVar5) {
      lVar7 = this->num_exp_search_iterations_;
      do {
        lVar7 = lVar7 + 1;
        if (piVar3[(int)(uVar12 - uVar8)] <= iVar4) break;
        this->num_exp_search_iterations_ = lVar7;
        uVar8 = uVar8 * 2;
      } while ((int)uVar8 < (int)uVar12);
    }
    uVar5 = uVar12;
    if ((int)uVar8 < (int)uVar12) {
      uVar5 = uVar8;
    }
    uVar6 = (ulong)(uVar12 - uVar5);
    iVar11 = -((int)uVar8 / 2);
  }
  else {
    iVar9 = iVar2 - uVar12;
    iVar11 = 1;
    if (1 < iVar9) {
      lVar7 = this->num_exp_search_iterations_;
      iVar11 = 1;
      do {
        lVar7 = lVar7 + 1;
        if (iVar4 < piVar3[(int)(iVar11 + uVar12)]) break;
        this->num_exp_search_iterations_ = lVar7;
        iVar11 = iVar11 * 2;
      } while (iVar11 < iVar9);
    }
    uVar6 = (ulong)(iVar11 / 2 + uVar12);
    if (iVar9 < iVar11) {
      iVar11 = iVar9;
    }
  }
  iVar11 = iVar11 + uVar12;
  while (iVar9 = iVar11, uVar5 = (uint)uVar6, (int)uVar5 < iVar9) {
    iVar10 = (int)(iVar9 - uVar5) / 2;
    iVar11 = iVar10 + uVar5;
    if (piVar3[iVar11] <= iVar4) {
      uVar6 = (ulong)(iVar10 + 1 + uVar5);
      iVar11 = iVar9;
    }
  }
  if ((int)uVar5 < (int)uVar12) {
    if (((int)uVar5 < 0) || (iVar2 <= (int)uVar5)) {
      __assert_fail("pos >= 0 && pos < data_capacity_",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex_nodes.h"
                    ,0x1dc,
                    "bool alex::AlexDataNode<int, int>::check_exists(int) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                   );
    }
    if ((this->bitmap_[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0) {
      iVar4 = get_next_filled_position(this,uVar5,true);
      uVar5 = iVar4 - 1U;
      if ((int)uVar12 <= (int)(iVar4 - 1U)) {
        uVar5 = uVar12;
      }
    }
  }
  return (pair<int,_int>)((ulong)uVar5 | uVar6 << 0x20);
}

Assistant:

inline int predict_position(const T& key) const {
    int position = this->model_.predict(key);
    position = std::max<int>(std::min<int>(position, data_capacity_ - 1), 0);
    return position;
  }